

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O2

int mbedtls_mpi_safe_cond_swap(mbedtls_mpi *X,mbedtls_mpi *Y,uchar swap)

{
  short sVar1;
  short sVar2;
  int iVar3;
  ulong uVar4;
  mbedtls_ct_condition_t cond;
  
  iVar3 = 0;
  if (X != Y) {
    uVar4 = swap ^ mbedtls_ct_zero;
    iVar3 = mbedtls_mpi_grow(X,(ulong)Y->n);
    if ((iVar3 == 0) && (iVar3 = mbedtls_mpi_grow(Y,(ulong)X->n), iVar3 == 0)) {
      cond = (long)(-(uVar4 >> 1) | -uVar4) >> 0x3f;
      sVar2 = X->s;
      sVar1 = mbedtls_ct_mpi_sign_if(cond,Y->s,sVar2);
      X->s = sVar1;
      sVar2 = mbedtls_ct_mpi_sign_if(cond,sVar2,Y->s);
      Y->s = sVar2;
      mbedtls_mpi_core_cond_swap(X->p,Y->p,(ulong)X->n,cond);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_mpi_safe_cond_swap(mbedtls_mpi *X,
                               mbedtls_mpi *Y,
                               unsigned char swap)
{
    int ret = 0;
    int s;

    if (X == Y) {
        return 0;
    }

    mbedtls_ct_condition_t do_swap = mbedtls_ct_bool(swap);

    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, Y->n));
    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(Y, X->n));

    s = X->s;
    X->s = mbedtls_ct_mpi_sign_if(do_swap, Y->s, X->s);
    Y->s = mbedtls_ct_mpi_sign_if(do_swap, s, Y->s);

    mbedtls_mpi_core_cond_swap(X->p, Y->p, X->n, do_swap);

cleanup:
    return ret;
}